

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_text.cpp
# Opt level: O0

void __thiscall
Am_Drawonable_Impl::Get_String_Extents
          (Am_Drawonable_Impl *this,Am_Font *Am_font,char *the_string,int the_string_length,
          int *width,int *ascent,int *descent,int *left_bearing,int *right_bearing)

{
  int iVar1;
  Am_Wrapper *value;
  XFontStruct *pXVar2;
  Am_Font_Size_Flag local_5c;
  bool local_57;
  bool local_56;
  bool local_55;
  Am_Font_Size_Flag size;
  bool is_underline;
  bool is_italic;
  bool is_bold;
  Am_Font_Data *pAStack_50;
  Am_Font_Family_Flag family;
  Am_Font_Data *font;
  XCharStruct the_overall;
  int the_direction;
  int *ascent_local;
  int *width_local;
  int the_string_length_local;
  char *the_string_local;
  Am_Font *Am_font_local;
  Am_Drawonable_Impl *this_local;
  
  unique0x10000132 = ascent;
  value = Am_Font::operator_cast_to_Am_Wrapper_(Am_font);
  pAStack_50 = Am_Font_Data::Narrow(value);
  if (pAStack_50 == (Am_Font_Data *)0x0) {
    *width = 0;
    *stack0xffffffffffffffc8 = 0;
    *descent = 0;
    *left_bearing = 0;
    *right_bearing = 0;
  }
  else {
    Am_Font_Data::Get_Values(pAStack_50,&size,&local_55,&local_56,&local_57,&local_5c);
    if ((((size == Am_FONT_VERY_LARGE) || (size == 4)) || (size == 6)) || (size == 5)) {
      iVar1 = unwrap_j(the_string,the_string_length);
      pXVar2 = Am_Font_Data::Get_X_Font(pAStack_50,this);
      XTextExtents16(pXVar2,buf16,iVar1,&the_overall.width,stack0xffffffffffffffc8,descent,&font);
    }
    else {
      pXVar2 = Am_Font_Data::Get_X_Font(pAStack_50,this);
      XTextExtents(pXVar2,the_string,the_string_length,&the_overall.width,stack0xffffffffffffffc8,
                   descent,&font);
    }
    *width = (int)font._4_2_;
    *left_bearing = (int)(short)font;
    *right_bearing = (int)font._2_2_;
    Am_Wrapper::Release(&pAStack_50->super_Am_Wrapper);
  }
  return;
}

Assistant:

void
Am_Drawonable_Impl::Get_String_Extents(const Am_Font &Am_font,
                                       const char *the_string,
                                       int the_string_length, int &width,
                                       int &ascent, int &descent,
                                       int &left_bearing, int &right_bearing)
{
  int the_direction;
  XCharStruct the_overall;

  Am_Font_Data *font = Am_Font_Data::Narrow(Am_font);

  if (font) {
    Am_Font_Family_Flag family;
    bool is_bold, is_italic, is_underline;
    Am_Font_Size_Flag size;
    font->Get_Values(family, is_bold, is_italic, is_underline, size);
    if (family == Am_FONT_JFIXED || family == Am_FONT_JPROPORTIONAL ||
        family == Am_FONT_KFIXED || family == Am_FONT_CFIXED) {
      the_string_length = unwrap_j(the_string, the_string_length);
      XTextExtents16(font->Get_X_Font(this), buf16, the_string_length,
                     &the_direction, &ascent, &descent, &the_overall);
    } else
      XTextExtents(font->Get_X_Font(this), the_string, the_string_length,
                   &the_direction, &ascent, &descent, &the_overall);
    width = the_overall.width;
    left_bearing = the_overall.lbearing;
    right_bearing = the_overall.rbearing;
    font->Release();
  } else {
    width = 0;
    ascent = 0;
    descent = 0;
    left_bearing = 0;
    right_bearing = 0;
  }
}